

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O3

vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> * __thiscall
dg::pta::PointerGraph::getNodes<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>
          (vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *__return_storage_ptr__,
          PointerGraph *this,vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *start,
          bool interprocedural,uint expected_num)

{
  BFS<dg::pta::PSNode,_DfsIdTracker,_EdgeChooser> bfs;
  NodesWalk<dg::pta::PSNode,dg::ADT::QueueFIFO<dg::pta::PSNode*>,dg::pta::PointerGraph::getNodes<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>(std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>const&,bool,unsigned_int)::DfsIdTracker,dg::pta::PointerGraph::getNodes<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>(std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>const&,bool,unsigned_int)::EdgeChooser>
  local_78 [4];
  int local_74;
  _Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> local_70;
  
  local_74 = *(int *)this + 1;
  *(int *)this = local_74;
  (__return_storage_ptr__->super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (expected_num != 0) {
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::reserve
              (__return_storage_ptr__,(ulong)expected_num);
    local_74 = *(int *)this;
  }
  local_70._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_70._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_70._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_70._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_70._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_70._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_70._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_70._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_70._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_70._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_78[0] = (NodesWalk<dg::pta::PSNode,dg::ADT::QueueFIFO<dg::pta::PSNode*>,dg::pta::PointerGraph::getNodes<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>(std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>const&,bool,unsigned_int)::DfsIdTracker,dg::pta::PointerGraph::getNodes<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>(std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>const&,bool,unsigned_int)::EdgeChooser>
                 )interprocedural;
  std::_Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::_M_initialize_map
            (&local_70,0);
  NodesWalk<dg::pta::PSNode,dg::ADT::QueueFIFO<dg::pta::PSNode*>,dg::pta::PointerGraph::getNodes<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>(std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>const&,bool,unsigned_int)::DfsIdTracker,dg::pta::PointerGraph::getNodes<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>(std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>const&,bool,unsigned_int)::EdgeChooser>
  ::
  run<dg::pta::PointerGraph::getNodes<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>(std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>const&,bool,unsigned_int)::_lambda(dg::pta::PSNode*)_1_,std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>
            (local_78,start,(anon_class_8_1_898a5c30)__return_storage_ptr__);
  std::_Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~_Deque_base(&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::vector<PSNode *> getNodes(const ContainerOrNode &start,
                                   bool interprocedural = true,
                                   unsigned expected_num = 0) {
        ++dfsnum;

        std::vector<PSNode *> cont;
        if (expected_num != 0)
            cont.reserve(expected_num);

        struct DfsIdTracker {
            const unsigned dfsnum;
            DfsIdTracker(unsigned dnum) : dfsnum(dnum) {}

            void visit(PSNode *n) { n->dfsid = dfsnum; }
            bool visited(PSNode *n) const { return n->dfsid == dfsnum; }
        };

        // iterate over successors and call (return) edges
        struct EdgeChooser {
            const bool interproc;
            EdgeChooser(bool inter = true) : interproc(inter) {}

            void foreach (PSNode *cur, std::function<void(PSNode *)> Dispatch) {
                if (interproc) {
                    if (PSNodeCall *C = PSNodeCall::get(cur)) {
                        for (auto *subg : C->getCallees()) {
                            Dispatch(subg->root);
                        }
                        // we do not need to iterate over succesors
                        // if we dive into the procedure (as we will
                        // return via call return)
                        // NOTE: we must iterate over successors if the
                        // function is undefined
                        if (!C->getCallees().empty())
                            return;
                    } else if (PSNodeRet *R = PSNodeRet::get(cur)) {
                        for (auto *ret : R->getReturnSites()) {
                            Dispatch(ret);
                        }
                        if (!R->getReturnSites().empty())
                            return;
                    }
                }

                for (auto *s : cur->successors())
                    Dispatch(s);
            }
        };

        DfsIdTracker visitTracker(dfsnum);
        EdgeChooser chooser(interprocedural);
        BFS<PSNode, DfsIdTracker, EdgeChooser> bfs(visitTracker, chooser);

        bfs.run(start, [&cont](PSNode *n) { cont.push_back(n); });

        return cont;
    }